

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void Logger::log_timestamp(void)

{
  time_t tVar1;
  ostream *poVar2;
  unsigned_long ts;
  stringstream local_1c0 [8];
  stringstream ss;
  ostream local_1b0;
  string local_38;
  
  std::__cxx11::stringstream::stringstream(local_1c0);
  tVar1 = time((time_t *)0x0);
  poVar2 = std::operator<<(&local_1b0,"Time elapsed: ");
  format_timestamp_abi_cxx11_(&local_38,(Logger *)(tVar1 - instance.timestamp_start),ts);
  poVar2 = std::operator<<(poVar2,(string *)&local_38);
  std::operator<<(poVar2,".");
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringbuf::str();
  log_info(&local_38,true);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void Logger::log_timestamp() {
  std::stringstream ss;
  auto current_time = (unsigned long) time(nullptr);
  ss << "Time elapsed: "
     << format_timestamp(current_time - instance.timestamp_start)
     << ".";
  log_info(ss.str());
}